

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp sexp_make_null_env_op(sexp ctx,sexp self,sexp_sint_t n,sexp version)

{
  sexp env;
  sexp psVar1;
  long lVar2;
  sexp core;
  sexp e;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_50.var = &e;
  e = (sexp)&DAT_0000043e;
  local_40.var = &core;
  core = (sexp)&DAT_0000043e;
  local_40.next = &local_50;
  local_50.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  e = sexp_make_env_op(ctx,self,(sexp_sint_t)&local_40);
  for (lVar2 = 0; lVar2 != 0xa0; lVar2 = lVar2 + 0x10) {
    core = sexp_alloc_tagged_aux(ctx,0x18,0x19);
    env = e;
    psVar1 = *(sexp *)((long)&core_forms[0].name + lVar2);
    (core->value).flonum = *(double *)(&core_forms[0].code + lVar2);
    (core->value).type.cpl = psVar1;
    psVar1 = sexp_intern(ctx,(char *)(core->value).type.cpl,-1);
    sexp_env_define(ctx,env,psVar1,core);
    psVar1 = sexp_c_string(ctx,(char *)(core->value).type.cpl,-1);
    (core->value).type.cpl = psVar1;
  }
  (ctx->value).context.saves = local_50.next;
  return e;
}

Assistant:

sexp sexp_make_null_env_op (sexp ctx, sexp self, sexp_sint_t n, sexp version) {
  sexp_uint_t i;
  sexp_gc_var2(e, core);
  sexp_gc_preserve2(ctx, e, core);
  e = sexp_make_env(ctx);
  for (i=0; i<(sizeof(core_forms)/sizeof(core_forms[0])); i++) {
    core = sexp_copy_core(ctx, &core_forms[i]);
    sexp_env_define(ctx, e, sexp_intern(ctx, (char*)sexp_core_name(core), -1), core);
    sexp_core_name(core) = sexp_c_string(ctx, (char*)sexp_core_name(core), -1);
  }
  sexp_gc_release2(ctx);
  return e;
}